

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int redefine_key(int f,int n)

{
  int iVar1;
  char *pcVar2;
  KEYMAP *curmap;
  ulong uVar3;
  char local_38 [8];
  char tmp [32];
  
  builtin_strncpy(redefine_key::buf,"Define key map: ",0x11);
  iVar1 = 0;
  pcVar2 = eread("%s",local_38,0x20,8,redefine_key::buf);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 2;
  }
  else if (*pcVar2 != '\0') {
    strlcat(redefine_key::buf,local_38,0x30);
    curmap = name_map(local_38);
    if (curmap == (KEYMAP *)0x0) {
      iVar1 = dobeep_msgs("Unknown map",local_38);
    }
    else {
      uVar3 = strlcat(redefine_key::buf,"key: ",0x30);
      if (uVar3 < 0x30) {
        iVar1 = dobind(curmap,redefine_key::buf,0);
      }
    }
  }
  return iVar1;
}

Assistant:

int
redefine_key(int f, int n)
{
	static char	 buf[48];
	char		 tmp[32], *bufp;
	KEYMAP		*mp;

	(void)strlcpy(buf, "Define key map: ", sizeof(buf));
	if ((bufp = eread("%s", tmp, sizeof(tmp), EFNEW, buf)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	(void)strlcat(buf, tmp, sizeof(buf));
	if ((mp = name_map(tmp)) == NULL)
		return (dobeep_msgs("Unknown map", tmp));

	if (strlcat(buf, "key: ", sizeof(buf)) >= sizeof(buf))
		return (FALSE);

	return (dobind(mp, buf, FALSE));
}